

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void el::Loggers::configureFromGlobal(char *globalConfigurationFilePath)

{
  Logger *pLVar1;
  size_type sVar2;
  char cVar3;
  bool bVar4;
  ostream *poVar5;
  string *psVar6;
  allocator local_419;
  Logger *logger;
  string line;
  string local_3f0;
  anon_class_16_2_58e2ca49 configure;
  stringstream ss;
  ostream local_3b0 [8];
  string local_3a8 [368];
  ifstream gcfStream;
  int aiStack_218 [122];
  
  std::ifstream::ifstream(&gcfStream,globalConfigurationFilePath,_S_in);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar5 = std::operator<<(local_3b0,"Unable to open global configuration file [");
    poVar5 = std::operator<<(poVar5,globalConfigurationFilePath);
    std::operator<<(poVar5,"] for parsing.");
    poVar5 = std::operator<<((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xb7b);
    poVar5 = std::operator<<(poVar5,") [gcfStream.is_open()");
    poVar5 = std::operator<<(poVar5,"] WITH MESSAGE \"");
    std::__cxx11::stringbuf::str();
    poVar5 = std::operator<<(poVar5,(string *)&line);
    poVar5 = std::operator<<(poVar5,"\"");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&line);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  configure.logger = &logger;
  logger = (Logger *)0x0;
  configure.ss = &ss;
LAB_00114139:
  do {
    do {
      if (*(int *)((long)aiStack_218 + *(long *)(_gcfStream + -0x18)) != 0) {
        std::__cxx11::stringbuf::str();
        pLVar1 = logger;
        std::__cxx11::string::~string((string *)&local_3f0);
        if ((local_3f0._M_string_length != 0) && (pLVar1 != (Logger *)0x0)) {
          configureFromGlobal::anon_class_16_2_58e2ca49::operator()(&configure);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        std::__cxx11::string::~string((string *)&line);
        std::ifstream::~ifstream(&gcfStream);
        return;
      }
      psVar6 = &line;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&gcfStream,(string *)&line);
      base::utils::Str::trim((Str *)&line,psVar6);
      bVar4 = Configurations::Parser::isComment(&line);
    } while (bVar4);
    Configurations::Parser::ignoreComments(&line);
    base::utils::Str::trim((Str *)&line,psVar6);
    if (2 < line._M_string_length) {
      std::__cxx11::string::string((string *)&local_3f0,"--",&local_419);
      bVar4 = base::utils::Str::startsWith(&line,&local_3f0);
      std::__cxx11::string::~string((string *)&local_3f0);
      if (bVar4) {
        std::__cxx11::stringbuf::str();
        sVar2 = local_3f0._M_string_length;
        pLVar1 = logger;
        std::__cxx11::string::~string((string *)&local_3f0);
        if ((sVar2 != 0) && (pLVar1 != (Logger *)0x0)) {
          configureFromGlobal::anon_class_16_2_58e2ca49::operator()(&configure);
        }
        std::__cxx11::string::string((string *)&local_3f0,"",&local_419);
        std::__cxx11::stringbuf::str(local_3a8);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::__cxx11::string::substr((ulong)&local_3f0,(ulong)&line);
        psVar6 = &local_3f0;
        std::__cxx11::string::operator=((string *)&line,(string *)&local_3f0);
        std::__cxx11::string::~string((string *)&local_3f0);
        base::utils::Str::trim((Str *)&line,psVar6);
        if (1 < line._M_string_length) {
          logger = getLogger(&line,true);
        }
        goto LAB_00114139;
      }
    }
    poVar5 = std::operator<<(local_3b0,(string *)&line);
    std::operator<<(poVar5,"\n");
  } while( true );
}

Assistant:

void Loggers::configureFromGlobal(const char* globalConfigurationFilePath) {
  std::ifstream gcfStream(globalConfigurationFilePath, std::ifstream::in);
  ELPP_ASSERT(gcfStream.is_open(), "Unable to open global configuration file [" << globalConfigurationFilePath
              << "] for parsing.");
  std::string line = std::string();
  std::stringstream ss;
  Logger* logger = nullptr;
  auto configure = [&](void) {
    ELPP_INTERNAL_INFO(8, "Configuring logger: '" << logger->id() << "' with configurations \n" << ss.str()
                       << "\n--------------");
    Configurations c;
    c.parseFromText(ss.str());
    logger->configure(c);
  };
  while (gcfStream.good()) {
    std::getline(gcfStream, line);
    ELPP_INTERNAL_INFO(1, "Parsing line: " << line);
    base::utils::Str::trim(line);
    if (Configurations::Parser::isComment(line)) continue;
    Configurations::Parser::ignoreComments(&line);
    base::utils::Str::trim(line);
    if (line.size() > 2 && base::utils::Str::startsWith(line, std::string(base::consts::kConfigurationLoggerId))) {
      if (!ss.str().empty() && logger != nullptr) {
        configure();
      }
      ss.str(std::string(""));
      line = line.substr(2);
      base::utils::Str::trim(line);
      if (line.size() > 1) {
        ELPP_INTERNAL_INFO(1, "Getting logger: '" << line << "'");
        logger = getLogger(line);
      }
    } else {
      ss << line << "\n";
    }
  }
  if (!ss.str().empty() && logger != nullptr) {
    configure();
  }
}